

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O2

void aGLDraw(AGLDrawSource *src,AGLDrawMerge *merge,AGLDrawTarget *target)

{
  undefined8 *puVar1;
  float fVar2;
  uint uVar3;
  GLenum GVar4;
  AGLCullMode AVar5;
  AGLFrontFace AVar6;
  AGLDepthParams AVar7;
  AGLProgramUniform *pAVar8;
  long lVar9;
  AGLAttribute *pAVar10;
  int *piVar11;
  AGLBuffer *pAVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  int iVar20;
  GLenum GVar21;
  anon_struct_64_3_f175164b *paVar22;
  GLuint GVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  AGLDepthMode AVar27;
  
  a__GLTargetBind(target);
  AVar7 = merge->depth;
  AVar27 = AVar7.mode;
  if (a__gl_state.depth.mode != AVar27) {
    if (AVar27 == AGLDM_Disabled) {
      glDisable(0xb71);
      a__gl_state.depth.mode = AVar27;
    }
    else {
      glEnable();
      glDepthMask(AVar27 == AGLDM_TestAndWrite);
      a__gl_state.depth.mode = AVar27;
    }
  }
  if (AVar27 != AGLDM_Disabled) {
    if (a__gl_state.depth.func != AVar7.func) {
      a__gl_state.depth.func = AVar7.func;
      glDepthFunc((ulong)AVar7 >> 0x20);
    }
  }
  iVar25 = (merge->blend).enable;
  if (iVar25 != a__gl_state.blend.enable) {
    a__gl_state.blend.enable = iVar25;
    if (iVar25 == 0) {
      glDisable(0xbe2);
      iVar25 = a__gl_state.blend.enable;
    }
    else {
      glEnable();
      iVar25 = a__gl_state.blend.enable;
    }
  }
  if (iVar25 != 0) {
    fVar2 = (merge->blend).color.r;
    if ((fVar2 != a__gl_state.blend.color.r) || (NAN(fVar2) || NAN(a__gl_state.blend.color.r))) {
LAB_00104929:
      a__gl_state.blend.color = (merge->blend).color;
      glBlendColor(a__gl_state.blend.color.r,a__gl_state.blend.color.g,a__gl_state.blend.color.b,
                   a__gl_state.blend.color.a);
    }
    else {
      fVar2 = (merge->blend).color.g;
      if ((fVar2 != a__gl_state.blend.color.g) || (NAN(fVar2) || NAN(a__gl_state.blend.color.g)))
      goto LAB_00104929;
      fVar2 = (merge->blend).color.b;
      if ((fVar2 != a__gl_state.blend.color.b) || (NAN(fVar2) || NAN(a__gl_state.blend.color.b)))
      goto LAB_00104929;
      fVar2 = (merge->blend).color.a;
      if ((fVar2 != a__gl_state.blend.color.a) || (NAN(fVar2) || NAN(a__gl_state.blend.color.a)))
      goto LAB_00104929;
    }
    if (((merge->blend).equation.rgb != a__gl_state.blend.equation.rgb) ||
       ((merge->blend).equation.a != a__gl_state.blend.equation.a)) {
      a__gl_state.blend.equation = (merge->blend).equation;
      if (a__gl_state.blend.equation.rgb == a__gl_state.blend.equation.a) {
        glBlendEquation();
      }
      else {
        glBlendEquationSeparate();
      }
    }
    if (((((merge->blend).func.src_rgb != a__gl_state.blend.func.src_rgb) ||
         ((merge->blend).func.dst_rgb != a__gl_state.blend.func.dst_rgb)) ||
        ((merge->blend).func.src_a != a__gl_state.blend.func.src_a)) ||
       ((merge->blend).func.dst_a != a__gl_state.blend.func.dst_a)) {
      a__gl_state.blend.func = (merge->blend).func;
      if (a__gl_state.blend.func.dst_rgb == a__gl_state.blend.func.dst_a &&
          a__gl_state.blend.func.src_rgb == a__gl_state.blend.func.src_a) {
        glBlendFunc();
      }
      else {
        glBlendFuncSeparate();
      }
    }
  }
  pAVar8 = (src->uniforms).p;
  uVar3 = (src->uniforms).n;
  glUseProgram(src->program);
  uVar24 = 0;
  uVar26 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar26 = uVar24;
  }
  iVar25 = 0;
  for (; uVar26 * 0x20 != uVar24; uVar24 = uVar24 + 0x20) {
    iVar20 = *(int *)((long)&(pAVar8->_).location + uVar24);
    if (iVar20 != -1) {
      switch(*(undefined4 *)((long)&pAVar8->type + uVar24)) {
      case 0:
        glUniform1fv(iVar20,*(undefined4 *)((long)&pAVar8->count + uVar24),
                     *(undefined8 *)((long)&pAVar8->value + uVar24));
        break;
      case 1:
        glUniform2fv(iVar20,*(undefined4 *)((long)&pAVar8->count + uVar24),
                     *(undefined8 *)((long)&pAVar8->value + uVar24));
        break;
      case 2:
        glUniform3fv(iVar20,*(undefined4 *)((long)&pAVar8->count + uVar24),
                     *(undefined8 *)((long)&pAVar8->value + uVar24));
        break;
      case 3:
        glUniform4fv(iVar20,*(undefined4 *)((long)&pAVar8->count + uVar24),
                     *(undefined8 *)((long)&pAVar8->value + uVar24));
        break;
      case 4:
        glUniformMatrix2fv(iVar20,*(undefined4 *)((long)&pAVar8->count + uVar24),0,
                           *(undefined8 *)((long)&pAVar8->value + uVar24));
        break;
      case 5:
        glUniformMatrix3fv(iVar20,*(undefined4 *)((long)&pAVar8->count + uVar24),0,
                           *(undefined8 *)((long)&pAVar8->value + uVar24));
        break;
      case 6:
        glUniformMatrix4fv(iVar20,*(undefined4 *)((long)&pAVar8->count + uVar24),0,
                           *(undefined8 *)((long)&pAVar8->value + uVar24));
        break;
      case 7:
        glUniform1iv(iVar20,*(undefined4 *)((long)&pAVar8->count + uVar24),
                     *(undefined8 *)((long)&pAVar8->value + uVar24));
        break;
      case 8:
        glUniform2iv(iVar20,*(undefined4 *)((long)&pAVar8->count + uVar24),
                     *(undefined8 *)((long)&pAVar8->value + uVar24));
        break;
      case 9:
        glUniform3iv(iVar20,*(undefined4 *)((long)&pAVar8->count + uVar24),
                     *(undefined8 *)((long)&pAVar8->value + uVar24));
        break;
      case 10:
        glUniform4iv(iVar20,*(undefined4 *)((long)&pAVar8->count + uVar24),
                     *(undefined8 *)((long)&pAVar8->value + uVar24));
        break;
      case 0xb:
        lVar9 = *(long *)((long)&pAVar8->value + uVar24);
        glActiveTexture(iVar25 + 0x84c0);
        glBindTexture(0xde1,*(undefined4 *)(lVar9 + 0x24));
        if (*(int *)(lVar9 + 0x28) != *(int *)(lVar9 + 0x14)) {
          glTexParameteri(0xde1,0x2801);
          *(undefined4 *)(lVar9 + 0x28) = *(undefined4 *)(lVar9 + 0x14);
        }
        if (*(int *)(lVar9 + 0x2c) != *(int *)(lVar9 + 0x18)) {
          glTexParameteri(0xde1,0x2800);
          *(undefined4 *)(lVar9 + 0x2c) = *(undefined4 *)(lVar9 + 0x18);
        }
        if (*(int *)(lVar9 + 0x30) != *(int *)(lVar9 + 0x1c)) {
          glTexParameteri(0xde1,0x2802);
          *(undefined4 *)(lVar9 + 0x30) = *(undefined4 *)(lVar9 + 0x1c);
        }
        if (*(int *)(lVar9 + 0x34) != *(int *)(lVar9 + 0x20)) {
          glTexParameteri(0xde1,0x2803);
          *(undefined4 *)(lVar9 + 0x34) = *(undefined4 *)(lVar9 + 0x20);
        }
        glUniform1i(iVar20);
        iVar25 = iVar25 + 1;
      }
    }
  }
  pAVar10 = (src->attribs).p;
  uVar3 = (src->attribs).n;
  a__gl_state.attribs_serial = a__gl_state.attribs_serial + 1;
  uVar24 = 0;
  uVar26 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar26 = uVar24;
  }
  for (; uVar26 * 0x30 - uVar24 != 0; uVar24 = uVar24 + 0x30) {
    piVar11 = *(int **)((long)&pAVar10->buffer + uVar24);
    if (piVar11 == (int *)0x0) {
      iVar25 = 0;
    }
    else {
      iVar25 = *piVar11;
    }
    uVar3 = *(uint *)((long)&(pAVar10->_).location + uVar24);
    if (-1 < (int)uVar3) {
      paVar22 = a__gl_state.attribs + uVar3;
      iVar20 = paVar22->buffer;
      if (iVar20 < 0) {
        glEnableVertexAttribArray(uVar3);
        iVar20 = paVar22->buffer;
      }
      if (iVar20 != iVar25) {
        glBindBuffer(0x8892,iVar25);
        paVar22->buffer = iVar25;
      }
      a__gl_state.attribs[uVar3].serial = a__gl_state.attribs_serial;
      iVar25 = *(int *)((long)&pAVar10->size + uVar24);
      if (a__gl_state.attribs[uVar3].attrib.size == iVar25) {
        GVar4 = a__gl_state.attribs[uVar3].attrib.type;
        GVar21 = *(GLenum *)((long)&pAVar10->type + uVar24);
        if (((GVar4 == GVar21) &&
            (GVar21 = GVar4,
            a__gl_state.attribs[uVar3].attrib.normalized == (&pAVar10->normalized)[uVar24])) &&
           ((a__gl_state.attribs[uVar3].attrib.stride == *(int *)((long)&pAVar10->stride + uVar24)
            && (a__gl_state.attribs[uVar3].attrib.ptr == *(GLvoid **)((long)&pAVar10->ptr + uVar24))
            ))) goto LAB_00104d28;
      }
      else {
        GVar21 = *(GLenum *)((long)&pAVar10->type + uVar24);
      }
      puVar1 = (undefined8 *)((long)&(pAVar10->_).location + uVar24);
      glVertexAttribPointer
                (uVar3,iVar25,GVar21,*(undefined1 *)(puVar1 + -2),
                 *(undefined4 *)((long)puVar1 + -0xc),puVar1[-1]);
      uVar13 = *(undefined4 *)(puVar1 + -5);
      uVar14 = *(undefined4 *)((long)puVar1 + -0x24);
      uVar15 = *(undefined4 *)(puVar1 + -4);
      uVar16 = *(undefined4 *)((long)puVar1 + -0x1c);
      uVar17 = puVar1[-3];
      uVar18 = puVar1[-2];
      uVar19 = *puVar1;
      a__gl_state.attribs[uVar3].attrib.ptr = (GLvoid *)puVar1[-1];
      *(undefined8 *)&a__gl_state.attribs[uVar3].attrib._ = uVar19;
      a__gl_state.attribs[uVar3].attrib.size = (int)uVar17;
      a__gl_state.attribs[uVar3].attrib.type = (int)((ulong)uVar17 >> 0x20);
      paVar22 = a__gl_state.attribs + uVar3;
      (paVar22->attrib).normalized = (char)uVar18;
      *(int3 *)&(paVar22->attrib).field_0x19 = (int3)((ulong)uVar18 >> 8);
      (paVar22->attrib).stride = (int)((ulong)uVar18 >> 0x20);
      *(undefined4 *)&a__gl_state.attribs[uVar3].attrib.name = uVar13;
      *(undefined4 *)((long)&a__gl_state.attribs[uVar3].attrib.name + 4) = uVar14;
      *(undefined4 *)&a__gl_state.attribs[uVar3].attrib.buffer = uVar15;
      *(undefined4 *)((long)&a__gl_state.attribs[uVar3].attrib.buffer + 4) = uVar16;
    }
LAB_00104d28:
  }
  paVar22 = a__gl_state.attribs;
  for (uVar26 = 0; uVar26 != 8; uVar26 = uVar26 + 1) {
    if ((-1 < paVar22->buffer) && (paVar22->serial != a__gl_state.attribs_serial)) {
      glDisableVertexAttribArray(uVar26 & 0xffffffff);
      paVar22->buffer = -1;
    }
    paVar22 = paVar22 + 1;
  }
  AVar5 = (src->primitive).cull_mode;
  AVar6 = (src->primitive).front_face;
  if (a__gl_state.cull_mode != AVar5) {
    if (AVar5 == AGLCM_Disable) {
      glDisable(0xb44);
      goto LAB_00104dbc;
    }
    if (a__gl_state.cull_mode == AGLCM_Disable) {
      glEnable(0xb44);
      goto LAB_00104dbc;
    }
    a__gl_state.cull_mode = AVar5;
    glCullFace();
  }
  if (a__gl_state.front_face != AVar6) {
    a__gl_state.front_face = AVar6;
    glFrontFace(AVar6);
  }
LAB_00104dbc:
  pAVar12 = (src->primitive).index.buffer;
  if (pAVar12 == (AGLBuffer *)0x0) {
    GVar23 = 0;
    if ((src->primitive).index.data.ptr == (GLvoid *)0x0) {
      glDrawArrays((src->primitive).mode,(src->primitive).first,(src->primitive).count);
      return;
    }
  }
  else {
    GVar23 = pAVar12->name;
  }
  glBindBuffer(0x8893,GVar23);
  glDrawElements((src->primitive).mode,(src->primitive).count,(src->primitive).index.type,
                 (src->primitive).index.data.ptr);
  return;
}

Assistant:

void aGLDraw(const AGLDrawSource *src, const AGLDrawMerge *merge, const AGLDrawTarget *target) {
	ATTO_GL_PROFILE_PREAMBLE
	a__GLTargetBind(target);

	a__GLDepthBind(merge->depth);
	a__GLBlendBind(&merge->blend);

	a__GLProgramBind(src->program, src->uniforms.p, src->uniforms.n);
	a__GLAttribsBind(src->attribs.p, src->attribs.n);
	a__GLCullingBind(src->primitive.cull_mode, src->primitive.front_face);

	if (src->primitive.index.buffer || src->primitive.index.data.ptr) {
		if (src->primitive.index.buffer) {
			/* FIXME store binding in state */
			AGL__CALL(glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, src->primitive.index.buffer->name));
		} else {
			AGL__CALL(glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0));
		}

		AGL__CALL(glDrawElements(
			src->primitive.mode, src->primitive.count, src->primitive.index.type, src->primitive.index.data.ptr));
	} else
		AGL__CALL(glDrawArrays(src->primitive.mode, src->primitive.first, src->primitive.count));
	ATTO_GL_PROFILE_FUNC("aGLDraw", aAppTime() - start);
}